

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssim.c
# Opt level: O3

double VP8SSIMFromStats(VP8DistoStats *stats)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  uVar4 = (ulong)stats->xm;
  uVar3 = (ulong)stats->ym;
  uVar1 = uVar3 * uVar3 + uVar4 * uVar4;
  if (uVar1 < 0x400000) {
    return 1.0;
  }
  lVar5 = (ulong)stats->xym * 0x100 - uVar3 * uVar4;
  lVar2 = 0;
  if (0 < lVar5) {
    lVar2 = lVar5;
  }
  lVar5 = (uVar3 * uVar4 * 2 + 0x140000) * (lVar2 * 2 + 0x3c0000U >> 8);
  lVar2 = (uVar1 + 0x140000) *
          ((((ulong)stats->yym + (ulong)stats->xxm) * 0x100 - uVar1) + 0x3c0000 >> 8);
  auVar6._8_4_ = (int)((ulong)lVar5 >> 0x20);
  auVar6._0_8_ = lVar5;
  auVar6._12_4_ = 0x45300000;
  auVar7._8_4_ = (int)((ulong)lVar2 >> 0x20);
  auVar7._0_8_ = lVar2;
  auVar7._12_4_ = 0x45300000;
  return ((auVar6._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) /
         ((auVar7._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0));
}

Assistant:

static WEBP_INLINE double SSIMCalculation(
    const VP8DistoStats* const stats, uint32_t N  /*num samples*/) {
  const uint32_t w2 =  N * N;
  const uint32_t C1 = 20 * w2;
  const uint32_t C2 = 60 * w2;
  const uint32_t C3 = 8 * 8 * w2;   // 'dark' limit ~= 6
  const uint64_t xmxm = (uint64_t)stats->xm * stats->xm;
  const uint64_t ymym = (uint64_t)stats->ym * stats->ym;
  if (xmxm + ymym >= C3) {
    const int64_t xmym = (int64_t)stats->xm * stats->ym;
    const int64_t sxy = (int64_t)stats->xym * N - xmym;    // can be negative
    const uint64_t sxx = (uint64_t)stats->xxm * N - xmxm;
    const uint64_t syy = (uint64_t)stats->yym * N - ymym;
    // we descale by 8 to prevent overflow during the fnum/fden multiply.
    const uint64_t num_S = (2 * (uint64_t)(sxy < 0 ? 0 : sxy) + C2) >> 8;
    const uint64_t den_S = (sxx + syy + C2) >> 8;
    const uint64_t fnum = (2 * xmym + C1) * num_S;
    const uint64_t fden = (xmxm + ymym + C1) * den_S;
    const double r = (double)fnum / fden;
    assert(r >= 0. && r <= 1.0);
    return r;
  }
  return 1.;   // area is too dark to contribute meaningfully
}